

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  cmCTestTestProperties *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  pointer pbVar8;
  string *label;
  pointer pbVar9;
  char *local_600 [4];
  _Base_ptr local_5e0;
  _Base_ptr local_5d8;
  cmWorkingDirectory workdir;
  ostringstream indexStr;
  ostringstream cmCTestLog_msg_5;
  long alStack_420 [45];
  cmCTestRunTest testRun;
  
  bVar4 = cmCTest::GetOutputAsJson(this->CTest);
  if (!bVar4) {
    pcVar1 = this->TestHandler;
    iVar5 = FindMaxIndex(this);
    pcVar1->MaxIndex = iVar5;
    local_5e0 = &(this->Properties).
                 super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var7 = (this->Properties).
             super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var7 != local_5e0) {
      pcVar2 = (cmCTestTestProperties *)p_Var7[1]._M_parent;
      cmWorkingDirectory::cmWorkingDirectory(&workdir,&pcVar2->Directory);
      cmCTestRunTest::cmCTestRunTest(&testRun,this);
      testRun.Index = pcVar2->Index;
      local_5d8 = p_Var7;
      testRun.TestProperties = pcVar2;
      cmCTestRunTest::ComputeArguments(&testRun);
      pbVar9 = (pcVar2->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = pbVar9;
      if (pbVar9 != (pcVar2->Labels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
        std::operator<<((ostream *)&indexStr,"Labels:");
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x517,_cmCTestLog_msg_5,this->Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
        pbVar9 = (pcVar2->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (pcVar2->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar9 != pbVar8; pbVar9 = pbVar9 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
        poVar6 = std::operator<<((ostream *)&indexStr," ");
        std::operator<<(poVar6,(string *)pbVar9);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x51b,_cmCTestLog_msg_5,this->Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
      }
      if ((pcVar2->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar2->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
        std::endl<char,std::char_traits<char>>((ostream *)&indexStr);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x520,_cmCTestLog_msg_5,this->Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
      }
      if (this->TestHandler->MemCheck == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
        std::operator<<((ostream *)&indexStr,"  Memory Check");
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x525,_cmCTestLog_msg_5,this->Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
        std::operator<<((ostream *)&indexStr,"  Test");
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x527,_cmCTestLog_msg_5,this->Quiet);
      }
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      poVar6 = std::operator<<((ostream *)&indexStr," #");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pcVar2->Index);
      std::operator<<(poVar6,":");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
      iVar5 = getNumWidth((long)this->TestHandler->MaxIndex);
      *(long *)((long)alStack_420 + *(long *)(_cmCTestLog_msg_5 + -0x18)) = (long)(iVar5 + 3);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&cmCTestLog_msg_5,(string *)local_600);
      std::__cxx11::string::~string((string *)local_600);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x52f,local_600[0],this->Quiet);
      std::__cxx11::string::~string((string *)local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_5," ");
      std::operator<<(poVar6,(string *)pcVar2);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x531,local_600[0],this->Quiet);
      std::__cxx11::string::~string((string *)local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      if (pcVar2->Disabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
        std::operator<<((ostream *)&cmCTestLog_msg_5," (Disabled)");
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x534,local_600[0],this->Quiet);
        std::__cxx11::string::~string((string *)local_600);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
      std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg_5);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x536,local_600[0],this->Quiet);
      std::__cxx11::string::~string((string *)local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
      cmCTestRunTest::~cmCTestRunTest(&testRun);
      cmWorkingDirectory::~cmWorkingDirectory(&workdir);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_5d8);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testRun);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&testRun);
    poVar6 = std::operator<<(poVar6,"Total Tests: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x53c,_indexStr,this->Quiet);
    std::__cxx11::string::~string((string *)&indexStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testRun);
    return;
  }
  PrintOutputAsJson(this);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  if (this->CTest->GetOutputAsJson()) {
    this->PrintOutputAsJson();
    return;
  }

  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Labels:", this->Quiet);
    }
    for (std::string const& label : p.Labels) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}